

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FailureReporterInterface * testing::internal::GetFailureReporter(void)

{
  int iVar1;
  FailureReporterInterface *__s;
  GoogleTestFailureReporter *in_stack_fffffffffffffff0;
  
  if (GetFailureReporter()::failure_reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFailureReporter()::failure_reporter);
    if (iVar1 != 0) {
      __s = (FailureReporterInterface *)operator_new(8);
      memset(__s,0,8);
      GoogleTestFailureReporter::GoogleTestFailureReporter(in_stack_fffffffffffffff0);
      GetFailureReporter::failure_reporter = __s;
      __cxa_guard_release(&GetFailureReporter()::failure_reporter);
    }
  }
  return GetFailureReporter::failure_reporter;
}

Assistant:

GTEST_API_ FailureReporterInterface* GetFailureReporter() {
  // Points to the global failure reporter used by Google Mock.  gcc
  // guarantees that the following use of failure_reporter is
  // thread-safe.  We may need to add additional synchronization to
  // protect failure_reporter if we port Google Mock to other
  // compilers.
  static FailureReporterInterface* const failure_reporter =
      new GoogleTestFailureReporter();
  return failure_reporter;
}